

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_map_sync_write
          (t_rs_generator *this,string *map_var,bool map_var_is_ref,t_map *tmap)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_type *ttype;
  t_type *ttype_00;
  ostream *poVar3;
  undefined7 in_register_00000011;
  char *pcVar4;
  t_rs_generator *this_00;
  allocator local_99;
  string local_98;
  undefined4 local_74;
  string local_70;
  string ref;
  
  local_74 = (undefined4)CONCAT71(in_register_00000011,map_var_is_ref);
  ttype = tmap->key_type_;
  ttype_00 = tmap->val_type_;
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&ref,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&ref);
  poVar3 = std::operator<<(poVar3,"o_prot.write_map_begin(");
  pcVar4 = "&TMapIdentifier::new(";
  poVar3 = std::operator<<(poVar3,"&TMapIdentifier::new(");
  to_rust_field_type_enum_abi_cxx11_(&local_98,(t_rs_generator *)pcVar4,ttype);
  poVar3 = std::operator<<(poVar3,(string *)&local_98);
  this_00 = (t_rs_generator *)0x2fdaef;
  poVar3 = std::operator<<(poVar3,", ");
  to_rust_field_type_enum_abi_cxx11_(&local_70,this_00,ttype_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(poVar3,(string *)map_var);
  poVar3 = std::operator<<(poVar3,".len() as i32)");
  poVar3 = std::operator<<(poVar3,")?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&ref);
  pcVar4 = "&";
  if ((char)local_74 != '\0') {
    pcVar4 = "";
  }
  std::__cxx11::string::string((string *)&ref,pcVar4,(allocator *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_98);
  poVar3 = std::operator<<(poVar3,"for (k, v) in ");
  poVar3 = std::operator<<(poVar3,(string *)&ref);
  poVar3 = std::operator<<(poVar3,(string *)map_var);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  std::__cxx11::string::string((string *)&local_70,"k",&local_99);
  string_container_write_variable(&local_98,this,ttype,&local_70);
  render_type_sync_write(this,&local_98,true,ttype);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_70,"v",&local_99);
  string_container_write_variable(&local_98,this,ttype_00,&local_70);
  render_type_sync_write(this,&local_98,true,ttype_00);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_70);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_98);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_abi_cxx11_(&local_98,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_98);
  poVar3 = std::operator<<(poVar3,"o_prot.write_map_end()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&ref);
  return;
}

Assistant:

void t_rs_generator::render_map_sync_write(const string &map_var, bool map_var_is_ref, t_map *tmap) {
  t_type* key_type = tmap->get_key_type();
  t_type* val_type = tmap->get_val_type();

  f_gen_
    << indent()
    << "o_prot.write_map_begin("
    << "&TMapIdentifier::new("
    << to_rust_field_type_enum(key_type) << ", "
    << to_rust_field_type_enum(val_type) << ", "
    << map_var << ".len() as i32)"
    << ")?;"
    << endl;

  string ref(map_var_is_ref ? "" : "&");
  f_gen_ << indent() << "for (k, v) in " << ref << map_var << " {" << endl;
  indent_up();
  render_type_sync_write(string_container_write_variable(key_type, "k"), true, key_type);
  render_type_sync_write(string_container_write_variable(val_type, "v"), true, val_type);
  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "o_prot.write_map_end()?;" << endl;
}